

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdAddTapBranchByHash(void *handle,void *tree_handle,char *branch_hash)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  bool bVar1;
  reference this_00;
  reference pvVar2;
  CfdException *this_01;
  allocator local_c1;
  ByteData256 hash;
  TapBranch local_a8;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_a8,"TapscriptTree",(allocator *)&hash);
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = cfd::capi::IsEmptyString(branch_hash);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_a8,branch_hash,&local_c1);
    cfd::core::ByteData256::ByteData256(&hash,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    this = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
            ((long)tree_handle + 0x18);
    if ((this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      pvVar2 = std::
               vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
               at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                    **)((long)tree_handle + 0x10),0);
      (*(pvVar2->super_TapBranch)._vptr_TapBranch[3])(pvVar2,&hash);
    }
    else {
      this_00 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(this,0)
      ;
      cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_a8,this_00);
      std::__cxx11::string::~string((string *)&local_a8);
      if (CONCAT44(local_a8._12_4_,local_a8._8_4_) == 0) {
        cfd::core::TapBranch::TapBranch(&local_a8,&hash,*(NetType *)((long)tree_handle + 0x20));
        cfd::core::TapBranch::operator=(this_00,&local_a8);
        cfd::core::TapBranch::~TapBranch(&local_a8);
      }
      else {
        (*this_00->_vptr_TapBranch[3])(this_00,&hash);
      }
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
    return 0;
  }
  local_a8._vptr_TapBranch = (_func_int **)0x5243e9;
  local_a8.has_leaf_ = true;
  local_a8.leaf_version_ = '\x02';
  local_a8._10_2_ = 0;
  local_a8.script_._vptr_Script = (_func_int **)0x524859;
  cfd::core::logger::warn<>((CfdSourceLocation *)&local_a8,"branch_hash is null or empty.");
  this_01 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_a8,"Failed to parameter. branch_hash is null or empty.",
             (allocator *)&hash);
  cfd::core::CfdException::CfdException(this_01,kCfdIllegalArgumentError,(string *)&local_a8);
  __cxa_throw(this_01,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTapBranchByHash(
    void* handle, void* tree_handle, const char* branch_hash) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(branch_hash)) {
      warn(CFD_LOG_SOURCE, "branch_hash is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. branch_hash is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    ByteData256 hash(branch_hash);
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = TapBranch(hash, buffer->net_type);  // override
      } else {
        branch.AddBranch(hash);
      }
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      tree.AddBranch(hash);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}